

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

void cdata_getconst(CTState *cts,TValue *o,CType *ct)

{
  CType *ctt;
  CType *ct_local;
  TValue *o_local;
  CTState *cts_local;
  
  if (((cts->tab[ct->info & 0xffff].info & 0x800000) == 0) || (-1 < (int)ct->size)) {
    o->n = (double)(int)ct->size;
  }
  else {
    o->n = (double)ct->size;
  }
  return;
}

Assistant:

static void cdata_getconst(CTState *cts, TValue *o, CType *ct)
{
  CType *ctt = ctype_child(cts, ct);
  lua_assert(ctype_isinteger(ctt->info) && ctt->size <= 4);
  /* Constants are already zero-extended/sign-extended to 32 bits. */
  if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
    setnumV(o, (lua_Number)(uint32_t)ct->size);
  else
    setintV(o, (int32_t)ct->size);
}